

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

parser_error parse_object_base_break(parser *p)

{
  long lVar1;
  wchar_t wVar2;
  parser_error pVar3;
  void *pvVar4;
  
  pvVar4 = parser_priv(p);
  if (pvVar4 != (void *)0x0) {
    lVar1 = *(long *)((long)pvVar4 + 0xb0);
    if (lVar1 == 0) {
      pVar3 = PARSE_ERROR_MISSING_RECORD_HEADER;
    }
    else {
      wVar2 = parser_getint(p,"breakage");
      *(wchar_t *)(lVar1 + 0xa0) = wVar2;
      pVar3 = PARSE_ERROR_NONE;
    }
    return pVar3;
  }
  __assert_fail("d",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-init.c"
                ,0x229,"enum parser_error parse_object_base_break(struct parser *)");
}

Assistant:

static enum parser_error parse_object_base_break(struct parser *p) {
	struct object_base *kb;
	struct kb_parsedata *d = parser_priv(p);

	assert(d);
	kb = d->kb;
	if (!kb) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	kb->break_perc = parser_getint(p, "breakage");
	return PARSE_ERROR_NONE;
}